

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O0

void u_UCharsToChars_63(UChar *us,char *cs,int32_t length)

{
  ushort local_1e;
  int local_1c;
  UChar u;
  char *pcStack_18;
  int32_t length_local;
  char *cs_local;
  UChar *us_local;
  
  pcStack_18 = cs;
  cs_local = (char *)us;
  for (local_1c = length; 0 < local_1c; local_1c = local_1c + -1) {
    local_1e = *(ushort *)cs_local;
    if ((0x7f < local_1e) ||
       ((invariantChars[(int)(uint)local_1e >> 5] & 1 << ((byte)local_1e & 0x1f)) == 0)) {
      local_1e = 0;
    }
    *pcStack_18 = (char)local_1e;
    pcStack_18 = pcStack_18 + 1;
    cs_local = cs_local + 2;
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_UCharsToChars(const UChar *us, char *cs, int32_t length) {
    UChar u;

    while(length>0) {
        u=*us++;
        if(!UCHAR_IS_INVARIANT(u)) {
            U_ASSERT(FALSE); /* Variant characters were used. These are not portable in ICU. */
            u=0;
        }
        *cs++=(char)UCHAR_TO_CHAR(u);
        --length;
    }
}